

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triplets.cpp
# Opt level: O2

void __thiscall
iDynTree::Triplets::addDiagonalMatrix
          (Triplets *this,size_t startingRow,size_t startingColumn,double value,
          size_t diagonalMatrixSize)

{
  bool bVar1;
  Triplet local_40;
  
  std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::reserve
            (&this->m_triplets,
             ((long)(this->m_triplets).
                    super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_triplets).
                   super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl
                   .super__Vector_impl_data._M_start) / 0x18 + diagonalMatrixSize);
  while (bVar1 = diagonalMatrixSize != 0, diagonalMatrixSize = diagonalMatrixSize - 1, bVar1) {
    Triplet::Triplet(&local_40,startingRow,startingColumn,value);
    std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::
    emplace_back<iDynTree::Triplet>(&this->m_triplets,&local_40);
    startingRow = startingRow + 1;
    startingColumn = startingColumn + 1;
  }
  return;
}

Assistant:

void Triplets::addDiagonalMatrix(std::size_t startingRow,
                                     std::size_t startingColumn,
                                     double value,
                                     std::size_t diagonalMatrixSize)
    {
        //if enough memory has been reserved this should be a noop
        m_triplets.reserve(m_triplets.size() + diagonalMatrixSize);
        for (std::size_t i = 0; i < diagonalMatrixSize; ++i) {
            m_triplets.push_back(Triplet(startingRow + i, startingColumn + i, value));
        }
    }